

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O2

optional<bool> __thiscall slang::ast::Symbol::isDeclaredBefore(Symbol *this,LookupLocation target)

{
  Symbol *symbol;
  ushort uVar1;
  uint uVar2;
  Scope *pSVar3;
  bool bVar4;
  LookupLocation LVar5;
  LookupLocation LVar6;
  
  pSVar3 = target.scope;
  uVar2 = target.index;
  LVar5 = LookupLocation::before(this);
  if (pSVar3 == (Scope *)0x0) {
LAB_0030bab3:
    bVar4 = LVar5.index < uVar2;
    uVar1 = 0x100;
  }
  else {
    do {
      if (pSVar3 == LVar5.scope) goto LAB_0030bab3;
      symbol = pSVar3->thisSym;
      LVar6 = LookupLocation::after(symbol);
      pSVar3 = LVar6.scope;
      bVar4 = false;
      uVar1 = 0;
    } while ((symbol->kind != CompilationUnit) &&
            (uVar2 = LVar6.index, uVar1 = 0, pSVar3 != (Scope *)0x0));
  }
  return (_Optional_base<bool,_true,_true>)(_Optional_base<bool,_true,_true>)(uVar1 | bVar4);
}

Assistant:

std::optional<bool> Symbol::isDeclaredBefore(LookupLocation target) const {
    LookupLocation ll = LookupLocation::before(*this);
    if (!target.getScope())
        return ll < target;

    // Walk up the target's tree until we find our own scope.
    while (target.getScope() != ll.getScope()) {
        auto& sym = target.getScope()->asSymbol();
        target = LookupLocation::after(sym);
        if (sym.kind == SymbolKind::CompilationUnit || !target.getScope())
            return std::nullopt;
    }

    return ll < target;
}